

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_lobster.cpp
# Opt level: O1

void __thiscall
flatbuffers::lobster::LobsterGenerator::CheckNameSpace
          (LobsterGenerator *this,Definition *def,string *code_ptr)

{
  int iVar1;
  long *plVar2;
  long *plVar3;
  string ns;
  long *local_80;
  long local_70;
  long lStack_68;
  string local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  BaseGenerator::GetNameSpace_abi_cxx11_(&local_60,&this->super_BaseGenerator,def);
  if (local_60._M_string_length == (this->current_namespace_)._M_string_length) {
    if (local_60._M_string_length == 0) goto LAB_002a1613;
    iVar1 = bcmp(local_60._M_dataplus._M_p,(this->current_namespace_)._M_dataplus._M_p,
                 local_60._M_string_length);
    if (iVar1 == 0) goto LAB_002a1613;
  }
  std::__cxx11::string::_M_assign((string *)&this->current_namespace_);
  std::operator+(&local_40,"namespace ",&local_60);
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_40);
  plVar3 = plVar2 + 2;
  if ((long *)*plVar2 == plVar3) {
    local_70 = *plVar3;
    lStack_68 = plVar2[3];
    local_80 = &local_70;
  }
  else {
    local_70 = *plVar3;
    local_80 = (long *)*plVar2;
  }
  *plVar2 = (long)plVar3;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  std::__cxx11::string::_M_append((char *)code_ptr,(ulong)local_80);
  if (local_80 != &local_70) {
    operator_delete(local_80,local_70 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
LAB_002a1613:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void CheckNameSpace(const Definition &def, std::string *code_ptr) {
    auto ns = GetNameSpace(def);
    if (ns == current_namespace_) return;
    current_namespace_ = ns;
    std::string &code = *code_ptr;
    code += "namespace " + ns + "\n\n";
  }